

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O0

void remora::bindings::
     matrix_assign_functor<remora::device_traits<remora::cpu_tag>::multiply_and_add<double>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::dense_tag>
               (matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1)

{
  dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
  *this;
  size_type sVar1;
  type rowM;
  size_t i;
  size_type in_stack_ffffffffffffffa8;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffb0;
  vector_expression<remora::dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffb8;
  multiply_and_add<double> in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  local_28 = 0;
  while( true ) {
    this = matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(param_1);
    sVar1 = dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
            ::size1(this);
    if (local_28 == sVar1) break;
    row<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    row<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    kernels::
    assign<remora::device_traits<remora::cpu_tag>::multiply_and_add<double>,remora::dense_vector_adaptor<double,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_ffffffffffffffb8,
               (vector_expression<remora::dense_vector_adaptor<const_double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void matrix_assign_functor(
	matrix_expression<M, cpu_tag>& m,
	matrix_expression<E, cpu_tag> const& e,
	F f,
	row_major, row_major, dense_tag, TagE
) {
	for(std::size_t i = 0; i != m().size1(); ++i){
		auto rowM = row(m,i);
		kernels::assign(rowM,row(e,i),f);
	}
}